

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O2

void MatchFinder_Init_2(CMatchFinder *p,int readData)

{
  uint uVar1;
  CLzRef *pCVar2;
  ulong uVar3;
  
  pCVar2 = p->hash;
  uVar1 = p->hashSizeSum;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    pCVar2[uVar3] = 0;
  }
  p->cyclicBufferPos = 0;
  p->buffer = p->bufferBase;
  p->streamPos = p->cyclicBufferSize;
  p->pos = p->cyclicBufferSize;
  p->result = 0;
  p->streamEndWasReached = '\0';
  if (readData != 0) {
    MatchFinder_ReadBlock(p);
  }
  MatchFinder_SetLimits(p);
  return;
}

Assistant:

void MatchFinder_Init_2(CMatchFinder *p, int readData)
{
  UInt32 i;
  UInt32 *hash = p->hash;
  UInt32 num = p->hashSizeSum;
  for (i = 0; i < num; i++)
    hash[i] = kEmptyHashValue;
  
  p->cyclicBufferPos = 0;
  p->buffer = p->bufferBase;
  p->pos = p->streamPos = p->cyclicBufferSize;
  p->result = SZ_OK;
  p->streamEndWasReached = 0;
  
  if (readData)
    MatchFinder_ReadBlock(p);
  
  MatchFinder_SetLimits(p);
}